

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDeformer.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::Deformer::Deformer
          (Deformer *this,uint64_t id,Element *element,Document *doc,string *name)

{
  string *doc_00;
  Token *this_00;
  Token *t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  shared_ptr<const_Assimp::FBX::PropertyTable> local_80;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  string *classname;
  Scope *local_38;
  Scope *sc;
  string *name_local;
  Document *doc_local;
  Element *element_local;
  uint64_t id_local;
  Deformer *this_local;
  
  sc = (Scope *)name;
  name_local = (string *)doc;
  doc_local = (Document *)element;
  element_local = (Element *)id;
  id_local = (uint64_t)this;
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Deformer_0037bab8;
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::shared_ptr(&this->props);
  local_38 = GetRequiredScope((Element *)doc_local);
  this_00 = GetRequiredToken((Element *)doc_local,2);
  ParseTokenAsString_abi_cxx11_(&local_70,(FBX *)this_00,t);
  doc_00 = name_local;
  local_50 = &local_70;
  std::operator+(&local_a0,"Deformer.Fbx",local_50);
  Util::GetPropertyTable
            ((Util *)&local_80,(Document *)doc_00,&local_a0,(Element *)doc_local,local_38,true);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::operator=(&this->props,&local_80);
  std::shared_ptr<const_Assimp::FBX::PropertyTable>::~shared_ptr(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

Deformer::Deformer(uint64_t id, const Element& element, const Document& doc, const std::string& name)
    : Object(id,element,name)
{
    const Scope& sc = GetRequiredScope(element);

    const std::string& classname = ParseTokenAsString(GetRequiredToken(element,2));
    props = GetPropertyTable(doc,"Deformer.Fbx" + classname,element,sc,true);
}